

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O3

void png_handle_IHDR(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_byte pVar1;
  byte bVar2;
  ulong uVar3;
  uint width;
  char *error_message;
  uint height;
  png_byte buf [13];
  
  if ((png_ptr->mode & 1) == 0) {
    if (length == 0xd) {
      png_ptr->mode = png_ptr->mode | 1;
      png_crc_read(png_ptr,buf,0xd);
      png_crc_finish(png_ptr,0);
      if ((-1 < (int)((uint)buf[0] << 0x18)) && (-1 < (int)((uint)buf[4] << 0x18))) {
        width = (uint)buf[3] | (uint)buf[1] << 0x10 | (uint)buf[2] << 8 | (uint)buf[0] << 0x18;
        height = (uint)buf[7] | (uint)buf[5] << 0x10 | (uint)buf[6] << 8 | (uint)buf[4] << 0x18;
        png_ptr->width = width;
        png_ptr->height = height;
        png_ptr->bit_depth = buf[8];
        png_ptr->interlaced = buf[0xc];
        png_ptr->color_type = buf[9];
        png_ptr->filter_type = buf[0xb];
        pVar1 = '\x01';
        if (buf[9] < 7) {
          pVar1 = (png_byte)(0x4010201030101 >> (buf[9] * '\b' & 0x3f));
        }
        png_ptr->compression_type = buf[10];
        png_ptr->channels = pVar1;
        bVar2 = pVar1 * buf[8];
        png_ptr->pixel_depth = bVar2;
        if (bVar2 < 8) {
          uVar3 = (ulong)bVar2 * (ulong)width + 7 >> 3;
        }
        else {
          uVar3 = (ulong)(bVar2 >> 3) * (ulong)width;
        }
        png_ptr->rowbytes = uVar3;
        png_set_IHDR(png_ptr,info_ptr,width,height,(uint)buf[8],(uint)buf[9],(uint)buf[0xc],
                     (uint)buf[10],(uint)buf[0xb]);
        return;
      }
      png_error(png_ptr,"PNG unsigned integer out of range");
    }
    error_message = "invalid";
  }
  else {
    error_message = "out of place";
  }
  png_chunk_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_handle_IHDR(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[13];
   png_uint_32 width, height;
   int bit_depth, color_type, compression_type, filter_type;
   int interlace_type;

   png_debug(1, "in png_handle_IHDR");

   if ((png_ptr->mode & PNG_HAVE_IHDR) != 0)
      png_chunk_error(png_ptr, "out of place");

   /* Check the length */
   if (length != 13)
      png_chunk_error(png_ptr, "invalid");

   png_ptr->mode |= PNG_HAVE_IHDR;

   png_crc_read(png_ptr, buf, 13);
   png_crc_finish(png_ptr, 0);

   width = png_get_uint_31(png_ptr, buf);
   height = png_get_uint_31(png_ptr, buf + 4);
   bit_depth = buf[8];
   color_type = buf[9];
   compression_type = buf[10];
   filter_type = buf[11];
   interlace_type = buf[12];

   /* Set internal variables */
   png_ptr->width = width;
   png_ptr->height = height;
   png_ptr->bit_depth = (png_byte)bit_depth;
   png_ptr->interlaced = (png_byte)interlace_type;
   png_ptr->color_type = (png_byte)color_type;
#ifdef PNG_MNG_FEATURES_SUPPORTED
   png_ptr->filter_type = (png_byte)filter_type;
#endif
   png_ptr->compression_type = (png_byte)compression_type;

   /* Find number of channels */
   switch (png_ptr->color_type)
   {
      default: /* invalid, png_set_IHDR calls png_error */
      case PNG_COLOR_TYPE_GRAY:
      case PNG_COLOR_TYPE_PALETTE:
         png_ptr->channels = 1;
         break;

      case PNG_COLOR_TYPE_RGB:
         png_ptr->channels = 3;
         break;

      case PNG_COLOR_TYPE_GRAY_ALPHA:
         png_ptr->channels = 2;
         break;

      case PNG_COLOR_TYPE_RGB_ALPHA:
         png_ptr->channels = 4;
         break;
   }

   /* Set up other useful info */
   png_ptr->pixel_depth = (png_byte)(png_ptr->bit_depth * png_ptr->channels);
   png_ptr->rowbytes = PNG_ROWBYTES(png_ptr->pixel_depth, png_ptr->width);
   png_debug1(3, "bit_depth = %d", png_ptr->bit_depth);
   png_debug1(3, "channels = %d", png_ptr->channels);
   png_debug1(3, "rowbytes = %lu", (unsigned long)png_ptr->rowbytes);
   png_set_IHDR(png_ptr, info_ptr, width, height, bit_depth,
       color_type, interlace_type, compression_type, filter_type);
}